

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FStatistics,_FStatistics>::Reserve(TArray<FStatistics,_FStatistics> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  FStatistics *pFVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  Grow(this,amount);
  uVar2 = this->Count;
  uVar6 = (ulong)uVar2;
  uVar5 = amount + uVar2;
  this->Count = uVar5;
  uVar4 = uVar6 << 5 | 0x18;
  for (; uVar6 < uVar5; uVar6 = uVar6 + 1) {
    pFVar3 = this->Array;
    puVar1 = (undefined8 *)((long)pFVar3 + (uVar4 - 0x18));
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)pFVar3 + (uVar4 - 8)) = 0x7ff1bc;
    *(undefined8 *)((long)&(pFVar3->stats).Array + uVar4) = 0x7ff1bc;
    FString::NullString.RefCount = FString::NullString.RefCount + 2;
    uVar5 = this->Count;
    uVar4 = uVar4 + 0x20;
  }
  return uVar2;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}